

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O1

int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int iFanin2)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pNode_00;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  void **ppvVar11;
  ulong uVar12;
  Hop_Obj_t *pHVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  bool bVar23;
  long local_b0;
  int local_a0;
  timespec ts;
  int pCands [12];
  
  if (p->pPars->fVeryVerbose == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = p->vDivs->nSize < 0x50;
  }
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                  ,0x148,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  if (iFanin2 < -1) {
    __assert_fail("iFanin2 >= 0 || iFanin2 == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                  ,0x149,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  pVVar3 = p->vDivCexes;
  if (0 < pVVar3->nSize) {
    iVar14 = p->nDivWords;
    lVar18 = 0;
    do {
      memset(pVVar3->pArray[lVar18],0xff,(long)iVar14 << 2);
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar3->nSize);
  }
  p->nCexes = 0;
  if (bVar7) {
    putchar(10);
    uVar15 = pNode->Id;
    uVar16 = *(uint *)&pNode->field_0x14;
    iVar14 = p->vDivs->nSize;
    uVar1 = (pNode->vFanins).nSize;
    pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[(uint)iFanin]];
    uVar19 = 0;
    if ((pNode_00->vFanouts).nSize == 1) {
      uVar8 = Abc_NodeMffcLabel(pNode_00);
      uVar19 = (ulong)uVar8;
    }
    printf("Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n",
           (ulong)uVar15,(ulong)(uVar16 >> 0xc),(ulong)(iVar14 - uVar1),(ulong)(uint)iFanin,
           (ulong)(uint)iFanin2,(ulong)uVar1,uVar19);
  }
  p->vMfsFanins->nSize = 0;
  local_a0 = 0;
  iVar14 = 0;
  if (0 < (pNode->vFanins).nSize) {
    uVar19 = 0;
    iVar14 = 0;
    do {
      if ((uint)iFanin2 != uVar19 && (uint)iFanin != uVar19) {
        pvVar4 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar19]];
        pVVar3 = p->vMfsFanins;
        uVar15 = pVVar3->nCap;
        if (pVVar3->nSize == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar11;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar15 * 2;
            if (iVar9 <= (int)uVar15) goto LAB_00448be7;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar15 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar3->pArray,(ulong)uVar15 << 4);
            }
            pVVar3->pArray = ppvVar11;
          }
          pVVar3->nCap = iVar9;
        }
LAB_00448be7:
        iVar9 = pVVar3->nSize;
        pVVar3->nSize = iVar9 + 1;
        pVVar3->pArray[iVar9] = pvVar4;
        uVar12 = (uint)(p->vDivs->nSize - (pNode->vFanins).nSize) + uVar19;
        iVar9 = (int)uVar12;
        if ((iVar9 < 0) || (p->vProjVarsSat->nSize <= iVar9)) goto LAB_004493f6;
        lVar18 = (long)iVar14;
        iVar14 = iVar14 + 1;
        pCands[lVar18] = p->vProjVarsSat->pArray[uVar12 & 0xffffffff] * 2 + 1;
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)(pNode->vFanins).nSize);
  }
  iVar9 = Abc_NtkMfsTryResubOnce(p,pCands,iVar14);
  if (iVar9 != -1) {
    if (iVar9 == 1) {
      if (bVar7) {
        printf("Node %d: Fanins %d/%d can be removed.\n",(ulong)(uint)pNode->Id,(ulong)(uint)iFanin,
               (ulong)(uint)iFanin2);
      }
      p->nNodesResub = p->nNodesResub + 1;
      p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar20 = 1;
      }
      else {
        lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        lVar20 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      pHVar13 = Abc_NtkMfsInterplate(p,pCands,iVar14);
      if (pHVar13 != (Hop_Obj_t *)0x0) {
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar13);
        iVar14 = clock_gettime(3,(timespec *)&ts);
        if (iVar14 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        lVar18 = lVar18 + lVar20;
LAB_004491ac:
        p->timeInt = p->timeInt + lVar18;
        local_a0 = 1;
      }
    }
    else {
      if (bVar7) {
        iVar9 = 0xb;
        do {
          putchar(0x20);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
        if ((pNode->vFanins).nSize < p->vDivs->nSize) {
          uVar15 = 0;
          do {
            printf("%d",(ulong)(uVar15 % 10));
            uVar15 = uVar15 + 1;
          } while ((int)uVar15 < p->vDivs->nSize - (pNode->vFanins).nSize);
        }
        if (0 < (pNode->vFanins).nSize) {
          iVar22 = 0;
          iVar9 = iFanin;
          do {
            iVar10 = iVar22 + 0x61;
            if (iVar22 == iFanin2) {
              iVar10 = 0x2a;
            }
            bVar23 = iVar9 == 0;
            iVar9 = iVar9 + -1;
            if (bVar23) {
              iVar10 = 0x2a;
            }
            putchar(iVar10);
            iVar22 = iVar22 + 1;
          } while (iVar22 < (pNode->vFanins).nSize);
        }
        putchar(10);
      }
      iVar9 = iVar14 + 2;
      uVar12 = 0xffffffff;
      uVar19 = 0xffffffff;
      do {
        if (bVar7) {
          printf("%3d: %2d %2d ",(ulong)(uint)p->nCexes,uVar19,uVar12 & 0xffffffff);
          if (0 < p->vDivs->nSize) {
            lVar18 = 0;
            do {
              if (p->vDivCexes->nSize <= lVar18) goto LAB_004493d7;
              uVar15 = p->nCexes - 1;
              printf("%d",(ulong)((*(uint *)((long)p->vDivCexes->pArray[lVar18] +
                                            (long)((int)uVar15 >> 5) * 4) >> (uVar15 & 0x1f) & 1) !=
                                 0));
              lVar18 = lVar18 + 1;
            } while (lVar18 < p->vDivs->nSize);
          }
          putchar(10);
        }
        uVar15 = ((p->nCexes >> 5) + 1) - (uint)((p->nCexes & 0x1fU) == 0);
        if (p->nDivWords < (int)uVar15) {
          __assert_fail("nWords <= p->nDivWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                        ,0x195,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
        }
        pVVar3 = p->vDivs;
        iVar22 = pVVar3->nSize;
        iVar10 = (pNode->vFanins).nSize;
        uVar16 = iVar22 - iVar10;
        uVar19 = 1;
        if (1 < (int)uVar16) {
          uVar1 = p->vDivCexes->nSize;
          uVar17 = 0;
          if (0 < (int)uVar1) {
            uVar17 = (ulong)uVar1;
          }
          if ((int)uVar1 < 2) {
            uVar1 = 1;
          }
          uVar19 = 1;
          do {
            if (uVar19 == uVar1) goto LAB_004493d7;
            ppvVar11 = p->vDivCexes->pArray;
            iVar2 = p->pPars->fPower;
            if (iVar2 == 0) {
LAB_00448f3e:
              uVar12 = 0;
              do {
                if (uVar12 == uVar17) goto LAB_004493d7;
                if (iVar2 == 0) {
LAB_00448f96:
                  uVar21 = 0;
                  if (0 < (int)uVar15) {
                    do {
                      if ((*(uint *)((long)ppvVar11[uVar12] + uVar21 * 4) |
                          *(uint *)((long)ppvVar11[uVar19] + uVar21 * 4)) != 0xffffffff)
                      goto LAB_00448fb6;
                      uVar21 = uVar21 + 1;
                    } while (uVar15 != uVar21);
                    uVar21 = (ulong)uVar15;
                  }
LAB_00448fb6:
                  if ((uint)uVar21 == uVar15) {
                    uVar19 = uVar19 & 0xffffffff;
                    goto LAB_00448ffc;
                  }
                }
                else {
                  if ((long)iVar22 <= (long)uVar12) goto LAB_004493d7;
                  pVVar5 = p->vProbs;
                  if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00448f96;
                  uVar8 = *(uint *)((long)pVVar3->pArray[uVar12] + 0x10);
                  if (pVVar5->nSize <= (int)uVar8) goto LAB_00448f96;
                  if ((int)uVar8 < 0) goto LAB_004493f6;
                  if ((float)pVVar5->pArray[uVar8] < 0.12) goto LAB_00448f96;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar19);
              uVar12 = uVar19 & 0xffffffff;
            }
            else {
              if ((long)iVar22 <= (long)uVar19) goto LAB_004493d7;
              pVVar5 = p->vProbs;
              if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00448f3e;
              uVar8 = *(uint *)((long)pVVar3->pArray[uVar19] + 0x10);
              if (pVVar5->nSize <= (int)uVar8) goto LAB_00448f3e;
              if ((int)uVar8 < 0) goto LAB_004493f6;
              if ((float)pVVar5->pArray[uVar8] < 0.12) goto LAB_00448f3e;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar16);
          uVar19 = (ulong)(uint)(iVar22 - iVar10);
        }
LAB_00448ffc:
        uVar15 = (uint)uVar19;
        if (uVar15 == uVar16) {
          return 0;
        }
        iVar22 = (int)uVar12;
        if ((iVar22 < 0) || (pVVar5 = p->vProjVarsSat, pVVar5->nSize <= iVar22)) {
LAB_004493f6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        local_a0 = 0;
        piVar6 = pVVar5->pArray;
        pCands[iVar14] = piVar6[uVar12 & 0xffffffff] * 2 + 1;
        if (pVVar5->nSize <= (int)uVar15) goto LAB_004493f6;
        pCands[iVar14 + 1] = piVar6[uVar19] * 2 + 1;
        iVar10 = Abc_NtkMfsTryResubOnce(p,pCands,iVar9);
        if (iVar10 == -1) {
          return 0;
        }
        if (iVar10 == 1) {
          if (bVar7) {
            printf("Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n",
                   (ulong)(uint)pNode->Id,(ulong)(uint)iFanin,(ulong)(uint)iFanin2,uVar19,
                   uVar12 & 0xffffffff);
          }
          p->nNodesResub = p->nNodesResub + 1;
          p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            local_b0 = 1;
          }
          else {
            lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            local_b0 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          pHVar13 = Abc_NtkMfsInterplate(p,pCands,iVar9);
          if (pHVar13 == (Hop_Obj_t *)0x0) {
            return 0;
          }
          if (p->vDivs->nSize <= iVar22) goto LAB_004493d7;
          pVVar3 = p->vMfsFanins;
          pvVar4 = p->vDivs->pArray[uVar12 & 0xffffffff];
          uVar16 = pVVar3->nCap;
          if (pVVar3->nSize == uVar16) {
            if ((int)uVar16 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar11 = (void **)malloc(0x80);
              }
              else {
                ppvVar11 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar11;
              iVar14 = 0x10;
            }
            else {
              iVar14 = uVar16 * 2;
              if (iVar14 <= (int)uVar16) goto LAB_0044929c;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar11 = (void **)malloc((ulong)uVar16 << 4);
              }
              else {
                ppvVar11 = (void **)realloc(pVVar3->pArray,(ulong)uVar16 << 4);
              }
              pVVar3->pArray = ppvVar11;
            }
            pVVar3->nCap = iVar14;
          }
LAB_0044929c:
          iVar14 = pVVar3->nSize;
          pVVar3->nSize = iVar14 + 1;
          pVVar3->pArray[iVar14] = pvVar4;
          if (p->vDivs->nSize <= (int)uVar15) {
LAB_004493d7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pVVar3 = p->vMfsFanins;
          pvVar4 = p->vDivs->pArray[uVar19];
          uVar15 = pVVar3->nCap;
          if (pVVar3->nSize == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar11 = (void **)malloc(0x80);
              }
              else {
                ppvVar11 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar11;
              iVar14 = 0x10;
            }
            else {
              iVar14 = uVar15 * 2;
              if (iVar14 <= (int)uVar15) goto LAB_00449351;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar11 = (void **)malloc((ulong)uVar15 << 4);
              }
              else {
                ppvVar11 = (void **)realloc(pVVar3->pArray,(ulong)uVar15 << 4);
              }
              pVVar3->pArray = ppvVar11;
            }
            pVVar3->nCap = iVar14;
          }
LAB_00449351:
          iVar14 = pVVar3->nSize;
          pVVar3->nSize = iVar14 + 1;
          pVVar3->pArray[iVar14] = pvVar4;
          if (p->vMfsFanins->nSize != iVar9) {
            __assert_fail("Vec_PtrSize(p->vMfsFanins) == nCands + 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                          ,0x1d1,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)")
            ;
          }
          Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar13);
          iVar14 = clock_gettime(3,(timespec *)&ts);
          if (iVar14 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          lVar18 = lVar18 + local_b0;
          goto LAB_004491ac;
        }
      } while (p->nCexes < p->pPars->nWinMax);
    }
  }
  return local_a0;
}

Assistant:

int Abc_NtkMfsSolveSatResub2( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int iFanin2 )
{
    int fVeryVerbose = p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 80;
    unsigned * pData, * pData2;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, iVar2, i, w, nCands, nWords, fBreak;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    assert( iFanin2 >= 0 || iFanin2 == -1 );

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( fVeryVerbose )
    {
        printf( "\n" );
        printf( "Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            iFanin, iFanin2, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin)) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin || i == iFanin2 )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( fVeryVerbose )
        printf( "Node %d: Fanins %d/%d can be removed.\n", pNode->Id, iFanin, iFanin2 );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        return 1;
    }

    if ( fVeryVerbose )
    {
        for ( i = 0; i < 11; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin || i == iFanin2 )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = iVar2 = -1;
    while ( 1 )
    {
#if 1 // sjang
#endif
        if ( fVeryVerbose )
        {
            printf( "%3d: %2d %2d ", p->nCexes, iVar, iVar2 );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        fBreak = 0;
        for ( iVar = 1; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
#if 1  // sjang
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
                    continue;
            }
#endif
            for ( iVar2 = 0; iVar2 < iVar; iVar2++ )
            {
                pData2 = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar2 );
#if 1 // sjang
	            if ( p->pPars->fPower )
		        {
			        Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar2);
				    // only accept the divisor if it is "cool"
					if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
						continue;
	            }
#endif
                for ( w = 0; w < nWords; w++ )
                    if ( (pData[w] | pData2[w]) != ~0 )
                        break;
                if ( w == nWords )
                {
                    fBreak = 1;
                    break;
                }
            }
            if ( fBreak )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands]   = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar2), 1 );
        pCands[nCands+1] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+2 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( fVeryVerbose )
            printf( "Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n", pNode->Id, iFanin, iFanin2, iVar, iVar2 );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+2 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar2) );
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            assert( Vec_PtrSize(p->vMfsFanins) == nCands + 2 );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    return 0;
}